

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeBuiltinVarInstance *this)

{
  pointer pSVar1;
  ostringstream *poVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer pSVar6;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  VkCommandBuffer commandBuffer;
  uint uVar9;
  undefined8 uVar10;
  Allocation *pAVar11;
  undefined8 uVar12;
  pointer pWVar13;
  pointer pWVar14;
  VkCommandPool VVar15;
  int i;
  uint uVar16;
  uint uVar17;
  ostream *this_01;
  long lVar18;
  Allocator *pAVar19;
  DescriptorSetLayoutBuilder *pDVar20;
  const_iterator cVar21;
  DescriptorPoolBuilder *pDVar22;
  DescriptorSetUpdateBuilder *pDVar23;
  uint uVar24;
  int iVar25;
  ulong bufferSize;
  uint uVar26;
  int iVar27;
  uint uVar28;
  bool bVar29;
  int local_5a8;
  uint local_5a4;
  uint local_5a0;
  uint local_59c;
  UVec3 resValue;
  VkCommandBuffer local_578;
  pointer pWStack_570;
  pointer local_568;
  VkAllocationCallbacks *pVStack_560;
  VkCommandBuffer local_550;
  TestContext *local_548;
  ulong local_540;
  UVec3 *local_538;
  UVec3 refGlobalID;
  UVec3 globalSize;
  UVec3 refValue;
  UVec3 refLocalID;
  UVec3 refGroupID;
  VkBufferMemoryBarrier bufferBarrier;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_480;
  VkDescriptorSetLayout local_468;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_460;
  VkCommandPool local_448;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_440;
  VkDescriptorPool local_428;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_420;
  VkPipeline local_408;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_400;
  VkShaderModule local_3e8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_3e0;
  size_t local_3c8;
  void *local_3c0;
  Buffer resultBuffer;
  Buffer uniformBuffer;
  Vector<unsigned_int,_3> res_3;
  pointer local_348;
  VkCommandPool VStack_340;
  pointer local_330;
  pointer local_328;
  pointer local_318;
  ios_base local_2e0 [264];
  VkDescriptorBufferInfo resultDescriptorInfo;
  VkDescriptorBufferInfo uniformDescriptorInfo;
  ostringstream program_name;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program_name);
  this_01 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&program_name,
                       compute::(anonymous_namespace)::s_prefixProgramName_abi_cxx11_,DAT_00da5f20);
  std::ostream::operator<<(this_01,this->m_subCaseNdx);
  pSVar6 = (this->m_subCases).
           super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = pSVar6 + this->m_subCaseNdx;
  local_538 = &pSVar6[this->m_subCaseNdx].m_numWorkGroups;
  globalSize.m_data[2] = 0;
  globalSize.m_data[0] = 0;
  globalSize.m_data[1] = 0;
  lVar18 = 0;
  do {
    globalSize.m_data[lVar18] =
         (pSVar1->m_numWorkGroups).m_data[lVar18] * (pSVar1->m_localSize).m_data[lVar18];
    uVar10 = globalSize.m_data._0_8_;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  uVar9 = globalSize.m_data[0];
  uVar24 = globalSize.m_data[1] * globalSize.m_data[0];
  uVar16 = glu::getDataTypeScalarSize(this->m_varType);
  uVar28 = (pSVar1->m_localSize).m_data[1];
  uVar26 = (pSVar1->m_localSize).m_data[0];
  uVar3 = (pSVar1->m_localSize).m_data[2];
  uVar4 = (pSVar1->m_numWorkGroups).m_data[0];
  uVar5 = (pSVar1->m_numWorkGroups).m_data[1];
  uVar17 = this->m_varType - TYPE_UINT;
  local_5a8 = 0;
  if (uVar17 < 4) {
    local_5a8 = *(int *)(&DAT_00b66720 + (ulong)uVar17 * 4);
  }
  uVar17 = (pSVar1->m_numWorkGroups).m_data[2];
  pDVar7 = this->m_vki;
  pVVar8 = this->m_device;
  pAVar19 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)&res_3,8,0x10);
  compute::Buffer::Buffer
            (&uniformBuffer,pDVar7,pVVar8,pAVar19,(VkBufferCreateInfo *)&res_3,
             (MemoryRequirement)0x1);
  pDVar7 = this->m_vki;
  pVVar8 = this->m_device;
  pAVar19 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  bufferSize = (ulong)(local_5a8 * uVar28 * uVar26 * uVar3 * uVar4 * uVar5 * uVar17);
  makeBufferCreateInfo((VkBufferCreateInfo *)&res_3,bufferSize,0x20);
  compute::Buffer::Buffer
            (&resultBuffer,pDVar7,pVVar8,pAVar19,(VkBufferCreateInfo *)&res_3,(MemoryRequirement)0x1
            );
  *(ulong *)(uniformBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
            m_hostPtr = (ulong)uVar24 | uVar10 << 0x20;
  ::vk::flushMappedMemoryRange
            (this->m_vki,this->m_device,
             (VkDeviceMemory)
             ((uniformBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (uniformBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,8);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&res_3)
  ;
  pDVar20 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&res_3,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,0x20
                       ,(VkSampler *)0x0);
  pDVar20 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar20,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&bufferBarrier,pDVar20,this->m_vki,
             this->m_device,0);
  DStack_460.m_device = (VkDevice)bufferBarrier._16_8_;
  DStack_460.m_allocator = (VkAllocationCallbacks *)bufferBarrier._24_8_;
  local_468.m_internal = bufferBarrier._0_8_;
  DStack_460.m_deviceIface = (DeviceInterface *)bufferBarrier.pNext;
  bufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarrier._4_4_ = 0;
  bufferBarrier.pNext = (void *)0x0;
  bufferBarrier.srcAccessMask = 0;
  bufferBarrier.dstAccessMask = 0;
  bufferBarrier.srcQueueFamilyIndex = 0;
  bufferBarrier.dstQueueFamilyIndex = 0;
  if (local_328 != (pointer)0x0) {
    operator_delete(local_328,(long)local_318 - (long)local_328);
  }
  if ((VkAllocationCallbacks *)VStack_340.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_340.m_internal,(long)local_330 - VStack_340.m_internal);
  }
  if (res_3.m_data._0_8_ != 0) {
    operator_delete((void *)res_3.m_data._0_8_,(long)local_348 - res_3.m_data._0_8_);
  }
  pDVar7 = this->m_vki;
  pVVar8 = this->m_device;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::stringbuf::str();
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&bufferBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&res_3,pDVar7,pVVar8,
             *(ProgramBinary **)(cVar21._M_node + 2),0);
  DStack_3e0.m_device = (VkDevice)local_348;
  DStack_3e0.m_allocator = (VkAllocationCallbacks *)VStack_340.m_internal;
  local_3e8.m_internal._0_4_ = res_3.m_data[0];
  local_3e8.m_internal._4_4_ = res_3.m_data[1];
  DStack_3e0.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffcb0;
  res_3.m_data[0] = 0;
  res_3.m_data[1] = 0;
  stack0xfffffffffffffcb0 = (pointer)0x0;
  local_348 = (pointer)0x0;
  VStack_340.m_internal = 0;
  if ((VkAccessFlags *)bufferBarrier._0_8_ != &bufferBarrier.srcAccessMask) {
    operator_delete((void *)bufferBarrier._0_8_,bufferBarrier._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&res_3,this->m_vki,this->m_device,
                     local_468);
  uVar10 = res_3.m_data._0_8_;
  DStack_480.m_device = (VkDevice)local_348;
  DStack_480.m_allocator = (VkAllocationCallbacks *)VStack_340.m_internal;
  DStack_480.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffcb0;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&res_3,this->m_vki,this->m_device,
                      (VkPipelineLayout)res_3.m_data._0_8_,local_3e8);
  DStack_400.m_device = (VkDevice)local_348;
  DStack_400.m_allocator = (VkAllocationCallbacks *)VStack_340.m_internal;
  local_408.m_internal._0_4_ = res_3.m_data[0];
  local_408.m_internal._4_4_ = res_3.m_data[1];
  DStack_400.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffcb0;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&bufferBarrier);
  pDVar22 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&bufferBarrier,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  pDVar22 = ::vk::DescriptorPoolBuilder::addType(pDVar22,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&res_3,pDVar22,this->m_vki,this->m_device,1,1)
  ;
  DStack_420.m_device = (VkDevice)local_348;
  DStack_420.m_allocator = (VkAllocationCallbacks *)VStack_340.m_internal;
  local_428.m_internal._0_4_ = res_3.m_data[0];
  local_428.m_internal._4_4_ = res_3.m_data[1];
  DStack_420.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffcb0;
  res_3.m_data[0] = 0;
  res_3.m_data[1] = 0;
  stack0xfffffffffffffcb0 = (pointer)0x0;
  local_348 = (pointer)0x0;
  VStack_340.m_internal = 0;
  if (bufferBarrier._0_8_ != 0) {
    operator_delete((void *)bufferBarrier._0_8_,bufferBarrier._16_8_ - bufferBarrier._0_8_);
  }
  makeBufferMemoryBarrier
            (&bufferBarrier,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&res_3,this->m_vki,this->m_device,
                  this->m_queueFamilyIndex);
  DStack_440.m_device = (VkDevice)local_348;
  DStack_440.m_allocator = (VkAllocationCallbacks *)VStack_340.m_internal;
  local_448.m_internal._0_4_ = res_3.m_data[0];
  local_448.m_internal._4_4_ = res_3.m_data[1];
  DStack_440.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffcb0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&res_3,this->m_vki,this->m_device,
             (VkCommandPool)res_3.m_data._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar15.m_internal = VStack_340.m_internal;
  pWVar14 = local_348;
  pWVar13 = stack0xfffffffffffffcb0;
  uVar12 = res_3.m_data._0_8_;
  local_550 = (VkCommandBuffer)res_3.m_data._0_8_;
  beginCommandBuffer(this->m_vki,(VkCommandBuffer)res_3.m_data._0_8_);
  (*this->m_vki->_vptr_DeviceInterface[0x4c])(this->m_vki,uVar12,1,local_408.m_internal);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&res_3,this->m_vki,this->m_device,
                    local_428,local_468);
  local_568 = local_348;
  pVStack_560 = (VkAllocationCallbacks *)VStack_340.m_internal;
  local_578 = (VkCommandBuffer)res_3.m_data._0_8_;
  pWStack_570 = stack0xfffffffffffffcb0;
  resultDescriptorInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultDescriptorInfo.offset = 0;
  resultDescriptorInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&res_3)
  ;
  pDVar23 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&res_3,(int)local_578,(void *)0x0,0);
  pDVar23 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write(pDVar23,(int)local_578,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar23,this->m_vki,this->m_device);
  if (local_328 != (pointer)0x0) {
    operator_delete(local_328,(long)local_318 - (long)local_328);
  }
  if ((VkAllocationCallbacks *)VStack_340.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_340.m_internal,(long)local_330 - VStack_340.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&res_3);
  commandBuffer = local_550;
  (*this->m_vki->_vptr_DeviceInterface[0x56])(this->m_vki,local_550,1,uVar10,0,1,&local_578,0,0);
  (*this->m_vki->_vptr_DeviceInterface[0x5d])
            (this->m_vki,commandBuffer,(ulong)(pSVar1->m_numWorkGroups).m_data[0],
             (ulong)(pSVar1->m_numWorkGroups).m_data[1],(ulong)(pSVar1->m_numWorkGroups).m_data[2]);
  (*this->m_vki->_vptr_DeviceInterface[0x6d])
            (this->m_vki,commandBuffer,0x800,0x4000,0,0,0,1,&bufferBarrier,0,0);
  endCommandBuffer(this->m_vki,commandBuffer);
  submitCommandsAndWait(this->m_vki,this->m_device,this->m_queue,commandBuffer);
  pAVar11 = resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (this->m_vki,this->m_device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  local_548 = ((this->super_TestInstance).m_context)->m_testCtx;
  if ((pSVar1->m_numWorkGroups).m_data[2] == 0) {
    iVar27 = 0;
  }
  else {
    local_3c0 = pAVar11->m_hostPtr;
    local_3c8 = (ulong)uVar16 << 2;
    local_540 = 0;
    iVar27 = 0;
    do {
      if ((pSVar1->m_numWorkGroups).m_data[1] != 0) {
        local_5a4 = 0;
        do {
          if (local_538->m_data[0] != 0) {
            local_5a0 = 0;
            do {
              if ((pSVar1->m_localSize).m_data[2] != 0) {
                local_59c = 0;
                do {
                  if ((pSVar1->m_localSize).m_data[1] != 0) {
                    uVar28 = 0;
                    do {
                      if ((pSVar1->m_localSize).m_data[0] != 0) {
                        uVar26 = 0;
                        do {
                          refGroupID.m_data[0] = local_5a0;
                          refGroupID.m_data[1] = local_5a4;
                          refGroupID.m_data[2] = (uint)local_540;
                          refLocalID.m_data[0] = uVar26;
                          refLocalID.m_data[1] = uVar28;
                          refLocalID.m_data[2] = local_59c;
                          stack0xfffffffffffffcb0 =
                               (pointer)((ulong)stack0xfffffffffffffcb0 & 0xffffffff00000000);
                          res_3.m_data[0] = 0;
                          res_3.m_data[1] = 0;
                          lVar18 = 0;
                          do {
                            res_3.m_data[lVar18] =
                                 (pSVar1->m_localSize).m_data[lVar18] * refGroupID.m_data[lVar18];
                            lVar18 = lVar18 + 1;
                          } while (lVar18 != 3);
                          refGlobalID.m_data[2] = 0;
                          refGlobalID.m_data[0] = 0;
                          refGlobalID.m_data[1] = 0;
                          lVar18 = 0;
                          do {
                            refGlobalID.m_data[lVar18] =
                                 refLocalID.m_data[lVar18] + res_3.m_data[lVar18];
                            lVar18 = lVar18 + 1;
                          } while (lVar18 != 3);
                          iVar25 = refGlobalID.m_data[1] * uVar9 + refGlobalID.m_data[2] * uVar24 +
                                   refGlobalID.m_data[0];
                          (*(this->m_builtin_var_case->super_TestCase).super_TestCase.super_TestNode
                            ._vptr_TestNode[7])
                                    (&refValue,this->m_builtin_var_case,local_538,pSVar1,&refGroupID
                                     ,&refLocalID);
                          resValue.m_data[2] = 0;
                          resValue.m_data[0] = 0;
                          resValue.m_data[1] = 0;
                          if (0 < (int)uVar16) {
                            memcpy(&resValue,
                                   (void *)((ulong)(uint)(iVar25 * local_5a8) + (long)local_3c0),
                                   local_3c8);
                          }
                          if (uVar16 == 3) {
                            bVar29 = true;
                            lVar18 = 0;
                            do {
                              if (bVar29) {
                                bVar29 = refValue.m_data[lVar18] == resValue.m_data[lVar18];
                              }
                              else {
                                bVar29 = false;
                              }
                              lVar18 = lVar18 + 1;
                            } while (lVar18 != 3);
                          }
                          else {
                            bVar29 = refValue.m_data[0] == resValue.m_data[0];
                          }
                          if (!bVar29) {
                            if (iVar27 < 10) {
                              res_3.m_data._0_8_ = local_548->m_log;
                              poVar2 = (ostringstream *)(res_3.m_data + 2);
                              std::__cxx11::ostringstream::ostringstream(poVar2);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)poVar2,"ERROR: comparison failed at offset ",
                                         0x23);
                              std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)poVar2,": expected ",0xb);
                              if (uVar16 == 3) {
                                tcu::operator<<((ostream *)(res_3.m_data + 2),&refValue);
                              }
                              else {
                                std::ostream::_M_insert<unsigned_long>((ulong)(res_3.m_data + 2));
                              }
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)(res_3.m_data + 2),", got ",6);
                              if (uVar16 == 3) {
                                tcu::operator<<((ostream *)(res_3.m_data + 2),&resValue);
                              }
                              else {
                                std::ostream::_M_insert<unsigned_long>((ulong)(res_3.m_data + 2));
                              }
                              tcu::MessageBuilder::operator<<
                                        ((MessageBuilder *)&res_3,
                                         (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0073ab4b:
                              std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)(res_3.m_data + 2));
                              std::ios_base::~ios_base(local_2e0);
                            }
                            else if (iVar27 == 10) {
                              res_3.m_data._0_8_ = local_548->m_log;
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)(res_3.m_data + 2));
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)(res_3.m_data + 2),"...",3);
                              tcu::MessageBuilder::operator<<
                                        ((MessageBuilder *)&res_3,
                                         (EndMessageToken *)&tcu::TestLog::EndMessage);
                              goto LAB_0073ab4b;
                            }
                            iVar27 = iVar27 + 1;
                          }
                          uVar26 = uVar26 + 1;
                        } while (uVar26 < (pSVar1->m_localSize).m_data[0]);
                      }
                      uVar28 = uVar28 + 1;
                    } while (uVar28 < (pSVar1->m_localSize).m_data[1]);
                  }
                  local_59c = local_59c + 1;
                } while (local_59c < (pSVar1->m_localSize).m_data[2]);
              }
              local_5a0 = local_5a0 + 1;
            } while (local_5a0 < local_538->m_data[0]);
          }
          local_5a4 = local_5a4 + 1;
        } while (local_5a4 < (pSVar1->m_numWorkGroups).m_data[1]);
      }
      uVar28 = (int)local_540 + 1;
      local_540 = (ulong)uVar28;
    } while (uVar28 < (pSVar1->m_numWorkGroups).m_data[2]);
  }
  res_3.m_data._0_8_ = local_548->m_log;
  poVar2 = (ostringstream *)(res_3.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_2e0);
  if (iVar27 < 1) {
    iVar25 = this->m_subCaseNdx + 1;
    this->m_subCaseNdx = iVar25;
    iVar27 = (int)((ulong)((long)(this->m_subCases).
                                 super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_subCases).
                                super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (SBORROW4(iVar25,iVar27 * -0x55555555) == iVar25 + iVar27 * 0x55555555 < 0) {
      res_3.m_data._0_8_ = &local_348;
      std::__cxx11::string::_M_construct<char_const*>((string *)&res_3,"Comparison succeeded","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,res_3.m_data._0_8_,
                 (long)&(stack0xfffffffffffffcb0->imageInfos).
                        super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start + res_3.m_data._0_8_);
    }
    else {
      tcu::TestStatus::incomplete();
    }
    if ((SBORROW4(iVar25,iVar27 * -0x55555555) != iVar25 + iVar27 * 0x55555555 < 0) ||
       ((pointer *)res_3.m_data._0_8_ == &local_348)) goto LAB_0073ad97;
  }
  else {
    res_3.m_data._0_8_ = &local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res_3,"Comparison failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,res_3.m_data._0_8_,
               (long)&(stack0xfffffffffffffcb0->imageInfos).
                      super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start + res_3.m_data._0_8_);
    if ((pointer *)res_3.m_data._0_8_ == &local_348) goto LAB_0073ad97;
  }
  operator_delete((void *)res_3.m_data._0_8_,
                  (ulong)((long)&(local_348->imageInfos).
                                 super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1));
LAB_0073ad97:
  if (local_578 != (VkCommandBuffer)0x0) {
    resultDescriptorInfo.buffer.m_internal = (deUint64)local_578;
    (*(code *)(pWStack_570->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x14].imageView.m_internal)
              (pWStack_570,local_568,pVStack_560,1);
  }
  if (local_550 != (VkCommandBuffer)0x0) {
    local_578 = local_550;
    (*(code *)(pWVar13->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x18].sampler.m_internal)
              (pWVar13,pWVar14,VVar15.m_internal,1);
  }
  if (local_448.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_440,local_448);
  }
  if (local_428.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_420,local_428);
  }
  if (local_408.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_400,local_408);
  }
  if (uVar10 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_480,(VkPipelineLayout)uVar10);
  }
  if (local_3e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_3e0,local_3e8);
  }
  if (local_468.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_460,local_468);
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if (uniformBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(uniformBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    uniformBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
    .m_data.ptr = (Allocation *)0x0;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program_name);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	ComputeBuiltinVarInstance::iterate (void)
{
	std::ostringstream program_name;
	program_name << s_prefixProgramName << m_subCaseNdx;

	const SubCase&				subCase				= m_subCases[m_subCaseNdx];
	const tcu::UVec3			globalSize			= subCase.localSize()*subCase.numWorkGroups();
	const tcu::UVec2			stride				(globalSize[0] * globalSize[1], globalSize[0]);
	const deUint32				sizeOfUniformBuffer	= sizeof(stride);
	const int					numScalars			= glu::getDataTypeScalarSize(m_varType);
	const deUint32				numInvocations		= subCase.localSize()[0] * subCase.localSize()[1] * subCase.localSize()[2] * subCase.numWorkGroups()[0] * subCase.numWorkGroups()[1] * subCase.numWorkGroups()[2];

	deUint32					resultBufferStride = 0;
	switch (m_varType)
	{
		case glu::TYPE_UINT:
			resultBufferStride = sizeof(deUint32);
			break;
		case glu::TYPE_UINT_VEC2:
			resultBufferStride = sizeof(tcu::UVec2);
			break;
		case glu::TYPE_UINT_VEC3:
		case glu::TYPE_UINT_VEC4:
			resultBufferStride = sizeof(tcu::UVec4);
			break;
		default:
			DE_ASSERT("Illegal data type");
	}

	const deUint32				resultBufferSize	= numInvocations * resultBufferStride;

	// Create result buffer
	Buffer uniformBuffer(m_vki, m_device, m_context.getDefaultAllocator(), makeBufferCreateInfo(sizeOfUniformBuffer, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT), MemoryRequirement::HostVisible);
	Buffer resultBuffer(m_vki, m_device, m_context.getDefaultAllocator(), makeBufferCreateInfo(resultBufferSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = uniformBuffer.getAllocation();
		memcpy(alloc.getHostPtr(), &stride, sizeOfUniformBuffer);
		flushMappedMemoryRange(m_vki, m_device, alloc.getMemory(), alloc.getOffset(), sizeOfUniformBuffer);
	}

	// Create descriptorSetLayout
	const Unique<VkDescriptorSetLayout>	descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(m_vki, m_device));

	const Unique<VkShaderModule> shaderModule(createShaderModule(m_vki, m_device, m_context.getBinaryCollection().get(program_name.str()), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(m_vki, m_device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(m_vki, m_device, *pipelineLayout, *shaderModule));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(m_vki, m_device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const VkBufferMemoryBarrier bufferBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSize);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(m_vki, m_device, m_queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(m_vki, m_device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(m_vki, *cmdBuffer);

	m_vki.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

	// Create descriptor set
	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(m_vki, m_device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo resultDescriptorInfo = makeDescriptorBufferInfo(*resultBuffer, 0ull, resultBufferSize);
	const VkDescriptorBufferInfo uniformDescriptorInfo = makeDescriptorBufferInfo(*uniformBuffer, 0ull, sizeOfUniformBuffer);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &uniformDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultDescriptorInfo)
		.update(m_vki, m_device);

	m_vki.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	// Dispatch indirect compute command
	m_vki.cmdDispatch(*cmdBuffer, subCase.numWorkGroups()[0], subCase.numWorkGroups()[1], subCase.numWorkGroups()[2]);

	m_vki.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
							 0, (const VkMemoryBarrier*)DE_NULL,
							 1, &bufferBarrier,
							 0, (const VkImageMemoryBarrier*)DE_NULL);

	// End recording commands
	endCommandBuffer(m_vki, *cmdBuffer);

	// Wait for command buffer execution finish
	submitCommandsAndWait(m_vki, m_device, m_queue, *cmdBuffer);

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(m_vki, m_device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSize);

	const deUint8*	 ptr = reinterpret_cast<deUint8*>(resultAlloc.getHostPtr());

	int			numFailed		= 0;
	const int	maxLogPrints	= 10;

	tcu::TestContext& testCtx	= m_context.getTestContext();

	for (deUint32 groupZ = 0; groupZ < subCase.numWorkGroups().z(); groupZ++)
	for (deUint32 groupY = 0; groupY < subCase.numWorkGroups().y(); groupY++)
	for (deUint32 groupX = 0; groupX < subCase.numWorkGroups().x(); groupX++)
	for (deUint32 localZ = 0; localZ < subCase.localSize().z(); localZ++)
	for (deUint32 localY = 0; localY < subCase.localSize().y(); localY++)
	for (deUint32 localX = 0; localX < subCase.localSize().x(); localX++)
	{
		const UVec3			refGroupID(groupX, groupY, groupZ);
		const UVec3			refLocalID(localX, localY, localZ);
		const UVec3			refGlobalID = refGroupID * subCase.localSize() + refLocalID;

		const deUint32		refOffset = stride.x()*refGlobalID.z() + stride.y()*refGlobalID.y() + refGlobalID.x();

		const UVec3			refValue = m_builtin_var_case->computeReference(subCase.numWorkGroups(), subCase.localSize(), refGroupID, refLocalID);

		const deUint32*		resPtr = (const deUint32*)(ptr + refOffset * resultBufferStride);
		const UVec3			resValue = readResultVec(resPtr, numScalars);

		if (!compareNumComponents(refValue, resValue, numScalars))
		{
			if (numFailed < maxLogPrints)
				testCtx.getLog()
				<< TestLog::Message
				<< "ERROR: comparison failed at offset " << refOffset
				<< ": expected " << LogComps(refValue, numScalars)
				<< ", got " << LogComps(resValue, numScalars)
				<< TestLog::EndMessage;
			else if (numFailed == maxLogPrints)
				testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

			numFailed += 1;
		}
	}

	testCtx.getLog() << TestLog::Message << (numInvocations - numFailed) << " / " << numInvocations << " values passed" << TestLog::EndMessage;

	if (numFailed > 0)
		return tcu::TestStatus::fail("Comparison failed");

	m_subCaseNdx += 1;
	return (m_subCaseNdx < (int)m_subCases.size()) ? tcu::TestStatus::incomplete() :tcu::TestStatus::pass("Comparison succeeded");
}